

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Savepoint.h
# Opt level: O0

void __thiscall ser::Savepoint::~Savepoint(Savepoint *this)

{
  Savepoint *this_local;
  
  MetainfoSet::~MetainfoSet(&this->metainfo_);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~Savepoint() { }